

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
          *this,triplet<unsigned_short> *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 aVar10;
  anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 aVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  pixel_type *ppVar16;
  undefined4 local_46;
  sample_type local_42;
  int32_t iStack_40;
  triplet<unsigned_short> rx;
  int32_t qs3;
  int32_t qs2;
  int32_t qs1;
  triplet<unsigned_short> rd;
  triplet<unsigned_short> rb;
  triplet<unsigned_short> rc;
  triplet<unsigned_short> ra;
  int32_t index;
  triplet<unsigned_short> *param_1_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
  *this_local;
  
  stack0xffffffffffffffe4 = 0;
  while (stack0xffffffffffffffe4 < this->width_) {
    ppVar16 = this->current_line_ + (int)(stack0xffffffffffffffe4 - 1);
    uVar5._0_2_ = ppVar16->field_0;
    uVar5._2_2_ = ppVar16->field_1;
    uVar1 = (ppVar16->field_2).v3;
    ppVar16 = this->previous_line_ + (int)(stack0xffffffffffffffe4 - 1);
    uVar6._0_2_ = ppVar16->field_0;
    uVar6._2_2_ = ppVar16->field_1;
    uVar2 = (ppVar16->field_2).v3;
    ppVar16 = this->previous_line_ + (int)stack0xffffffffffffffe4;
    uVar7._0_2_ = ppVar16->field_0;
    uVar7._2_2_ = ppVar16->field_1;
    uVar3 = (ppVar16->field_2).v3;
    ppVar16 = this->previous_line_ + (int)(stack0xffffffffffffffe4 + 1);
    uVar8._0_2_ = ppVar16->field_0;
    uVar8._2_2_ = ppVar16->field_1;
    uVar4 = (ppVar16->field_2).v3;
    iVar12 = quantize_gradient(this,(uVar8 & 0xffff) - (uVar7 & 0xffff));
    iVar13 = quantize_gradient(this,(uVar7 & 0xffff) - (uVar6 & 0xffff));
    iVar14 = quantize_gradient(this,(uVar6 & 0xffff) - (uVar5 & 0xffff));
    iVar12 = compute_context_id(iVar12,iVar13,iVar14);
    iVar13 = quantize_gradient(this,(uVar8 >> 0x10) - (uint)(ushort)uVar7._2_2_);
    iVar14 = quantize_gradient(this,(uint)(ushort)uVar7._2_2_ - (uint)(ushort)uVar6._2_2_);
    iVar15 = quantize_gradient(this,(uint)(ushort)uVar6._2_2_ - (uint)(ushort)uVar5._2_2_);
    rx._2_4_ = compute_context_id(iVar13,iVar14,iVar15);
    iVar13 = quantize_gradient(this,(uint)uVar4 - (uint)uVar3);
    iVar14 = quantize_gradient(this,(uint)uVar3 - (uint)uVar2);
    iVar15 = quantize_gradient(this,(uint)uVar2 - (uint)uVar1);
    iStack_40 = compute_context_id(iVar13,iVar14,iVar15);
    if (((iVar12 == 0) && (rx._2_4_ == 0)) && (iStack_40 == 0)) {
      iVar12 = do_run_mode(this,stack0xffffffffffffffe4,(encoder_strategy *)0x0);
      register0x00000000 = iVar12 + stack0xffffffffffffffe4;
    }
    else {
      triplet<unsigned_short>::triplet((triplet<unsigned_short> *)&local_46);
      uVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_0.v1;
      iVar13 = get_predicted_value(uVar5 & 0xffff,uVar7 & 0xffff,uVar6 & 0xffff);
      aVar10.v1 = do_regular(this,iVar12,(uint)uVar4,iVar13,(encoder_strategy *)0x0);
      uVar9 = rx._2_4_;
      local_46._0_2_ = aVar10.v1;
      uVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_1.v2;
      iVar12 = get_predicted_value((uint)(ushort)uVar5._2_2_,(uint)(ushort)uVar7._2_2_,
                                   (uint)(ushort)uVar6._2_2_);
      aVar11.v2 = do_regular(this,uVar9,(uint)uVar4,iVar12,(encoder_strategy *)0x0);
      uVar9 = iStack_40;
      local_46._2_2_ = aVar11.v2;
      uVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_2.v3;
      iVar12 = get_predicted_value((uint)uVar1,(uint)uVar3,(uint)uVar2);
      local_42 = do_regular(this,uVar9,(uint)uVar4,iVar12,(encoder_strategy *)0x0);
      ppVar16 = this->current_line_ + (int)stack0xffffffffffffffe4;
      ppVar16->field_0 = local_46._0_2_;
      ppVar16->field_1 = local_46._2_2_;
      (ppVar16->field_2).v3 = local_42;
      register0x00000000 = stack0xffffffffffffffe4 + 1;
    }
  }
  return;
}

Assistant:

void do_line(triplet<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const triplet<sample_type> ra{current_line_[index - 1]};
            const triplet<sample_type> rc{previous_line_[index - 1]};
            const triplet<sample_type> rb{previous_line_[index]};
            const triplet<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                triplet<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }